

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-parser-test-suite.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  yaml_event_type_t yVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sStack_280;
  yaml_event_t event;
  yaml_parser_t parser;
  
  if (argc == 2) {
    __stream = fopen(argv[1],"rb");
  }
  else {
    __stream = _stdin;
    if (argc != 1) {
      pcVar3 = "Usage: libyaml-parser [<input-file>]\n";
      sStack_280 = 0x25;
      goto LAB_00102551;
    }
  }
  if (__stream == (FILE *)0x0) {
    pcVar3 = "input";
    __line = 0x16;
  }
  else {
    iVar2 = yaml_parser_initialize(&parser);
    if (iVar2 == 0) {
      pcVar3 = "Could not initialize the parser object\n";
      sStack_280 = 0x27;
LAB_00102551:
      fwrite(pcVar3,sStack_280,1,_stderr);
      return 1;
    }
    yaml_parser_set_input_file(&parser,(FILE *)__stream);
    do {
      iVar2 = yaml_parser_parse(&parser,&event);
      yVar1 = event.type;
      if (iVar2 == 0) {
        fprintf(_stderr,"Parse error: %s\n",parser.problem);
        return 1;
      }
      switch(event.type) {
      case YAML_NO_EVENT:
        pcVar3 = "???";
        break;
      case YAML_STREAM_START_EVENT:
        pcVar3 = "+STR";
        break;
      case YAML_STREAM_END_EVENT:
        pcVar3 = "-STR";
        break;
      case YAML_DOCUMENT_START_EVENT:
        printf("+DOC");
        if (event.data.document_start.implicit == 0) {
          pcVar3 = " ---";
LAB_0010238f:
          printf(pcVar3);
        }
        goto LAB_001024b4;
      case YAML_DOCUMENT_END_EVENT:
        printf("-DOC");
        if (event.data.stream_start.encoding == YAML_ANY_ENCODING) {
          pcVar3 = " ...";
          goto LAB_0010238f;
        }
        goto LAB_001024b4;
      case YAML_ALIAS_EVENT:
        printf("=ALI *%s\n",CONCAT44(event.data._4_4_,event.data.stream_start.encoding));
        goto LAB_001024bc;
      case YAML_SCALAR_EVENT:
        printf("=VAL");
        if (CONCAT44(event.data._4_4_,event.data.stream_start.encoding) != 0) {
          printf(" &%s");
        }
        if (event.data.document_start.tag_directives.start != (yaml_tag_directive_t *)0x0) {
          printf(" <%s>");
        }
        pcVar3 = " :";
        switch(event.data.scalar.style) {
        case YAML_ANY_SCALAR_STYLE:
          goto switchD_0010232a_default;
        case YAML_PLAIN_SCALAR_STYLE:
          break;
        case YAML_SINGLE_QUOTED_SCALAR_STYLE:
          pcVar3 = " \'";
          break;
        case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
          pcVar3 = " \"";
          break;
        case YAML_LITERAL_SCALAR_STYLE:
          pcVar3 = " |";
          break;
        case YAML_FOLDED_SCALAR_STYLE:
          pcVar3 = " >";
          break;
        default:
          goto switchD_00102463_default;
        }
        printf(pcVar3);
switchD_00102463_default:
        print_escaped(event.data.scalar.value,
                      CONCAT44(event.data.scalar.length._4_4_,event.data.document_start.implicit));
        goto LAB_001024b4;
      case YAML_SEQUENCE_START_EVENT:
        pcVar3 = "+SEQ";
        goto LAB_001023a2;
      case YAML_SEQUENCE_END_EVENT:
        pcVar3 = "-SEQ";
        break;
      case YAML_MAPPING_START_EVENT:
        pcVar3 = "+MAP";
LAB_001023a2:
        printf(pcVar3);
        if (CONCAT44(event.data._4_4_,event.data.stream_start.encoding) != 0) {
          printf(" &%s");
        }
        if (event.data.document_start.tag_directives.start != (yaml_tag_directive_t *)0x0) {
          printf(" <%s>");
        }
LAB_001024b4:
        putchar(10);
        goto LAB_001024bc;
      case YAML_MAPPING_END_EVENT:
        pcVar3 = "-MAP";
        break;
      default:
switchD_0010232a_default:
        abort();
      }
      puts(pcVar3);
LAB_001024bc:
      yaml_event_delete(&event);
    } while (yVar1 != YAML_STREAM_END_EVENT);
    iVar2 = fclose(__stream);
    if (iVar2 == 0) {
      yaml_parser_delete(&parser);
      fflush(_stdout);
      return 0;
    }
    pcVar3 = "!fclose(input)";
    __line = 0x73;
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/run-parser-test-suite.c"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *input;
    yaml_parser_t parser;
    yaml_event_t event;

    if (argc == 1)
        input = stdin;
    else if (argc == 2)
        input = fopen(argv[1], "rb");
    else {
        fprintf(stderr, "Usage: libyaml-parser [<input-file>]\n");
        return 1;
    }
    assert(input);

    if (!yaml_parser_initialize(&parser)) {
        fprintf(stderr, "Could not initialize the parser object\n");
        return 1;
    }
    yaml_parser_set_input_file(&parser, input);

    while (1) {
        yaml_event_type_t type;
        if (!yaml_parser_parse(&parser, &event)) {
            fprintf(stderr, "Parse error: %s\n", parser.problem);
            return 1;
        }
        type = event.type;

        if (type == YAML_NO_EVENT)
            printf("???\n");
        else if (type == YAML_STREAM_START_EVENT)
            printf("+STR\n");
        else if (type == YAML_STREAM_END_EVENT)
            printf("-STR\n");
        else if (type == YAML_DOCUMENT_START_EVENT) {
            printf("+DOC");
            if (!event.data.document_start.implicit)
                printf(" ---");
            printf("\n");
        }
        else if (type == YAML_DOCUMENT_END_EVENT) {
            printf("-DOC");
            if (!event.data.document_end.implicit)
                printf(" ...");
            printf("\n");
        }
        else if (type == YAML_MAPPING_START_EVENT) {
            printf("+MAP");
            if (event.data.mapping_start.anchor)
                printf(" &%s", event.data.mapping_start.anchor);
            if (event.data.mapping_start.tag)
                printf(" <%s>", event.data.mapping_start.tag);
            printf("\n");
        }
        else if (type == YAML_MAPPING_END_EVENT)
            printf("-MAP\n");
        else if (type == YAML_SEQUENCE_START_EVENT) {
            printf("+SEQ");
            if (event.data.sequence_start.anchor)
                printf(" &%s", event.data.sequence_start.anchor);
            if (event.data.sequence_start.tag)
                printf(" <%s>", event.data.sequence_start.tag);
            printf("\n");
        }
        else if (type == YAML_SEQUENCE_END_EVENT)
            printf("-SEQ\n");
        else if (type == YAML_SCALAR_EVENT) {
            printf("=VAL");
            if (event.data.scalar.anchor)
                printf(" &%s", event.data.scalar.anchor);
            if (event.data.scalar.tag)
                printf(" <%s>", event.data.scalar.tag);
            switch (event.data.scalar.style) {
            case YAML_PLAIN_SCALAR_STYLE:
                printf(" :");
                break;
            case YAML_SINGLE_QUOTED_SCALAR_STYLE:
                printf(" '");
                break;
            case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
                printf(" \"");
                break;
            case YAML_LITERAL_SCALAR_STYLE:
                printf(" |");
                break;
            case YAML_FOLDED_SCALAR_STYLE:
                printf(" >");
                break;
            case YAML_ANY_SCALAR_STYLE:
                abort();
            }
            print_escaped(event.data.scalar.value, event.data.scalar.length);
            printf("\n");
        }
        else if (type == YAML_ALIAS_EVENT)
            printf("=ALI *%s\n", event.data.alias.anchor);
        else
            abort();

        yaml_event_delete(&event);

        if (type == YAML_STREAM_END_EVENT)
            break;
    }

    assert(!fclose(input));
    yaml_parser_delete(&parser);
    fflush(stdout);

    return 0;
}